

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31cExplicitUniformLocationTest.cpp
# Opt level: O0

long __thiscall glcts::anon_unknown_0::SubroutineIndexLoc::Run(SubroutineIndexLoc *this)

{
  long lVar1;
  UniformValueGenerator *generator;
  LayoutSpecifier<glcts::(anonymous_namespace)::IndexSpecifier> _index;
  DefOccurence local_46c;
  LayoutSpecifierBase local_468;
  LayoutSpecifierBase local_458;
  SubroutineUniform local_448;
  undefined1 local_2e0 [8];
  vector<glcts::(anonymous_namespace)::SubroutineUniform,_std::allocator<glcts::(anonymous_namespace)::SubroutineUniform>_>
  subroutineUniforms;
  SubroutineFunction local_298;
  LayoutSpecifierBase local_190;
  LayoutSpecifierBase local_180;
  LayoutSpecifierBase local_160;
  SubroutineFunction local_150;
  undefined1 local_48 [8];
  SubroutineFunctionSet functions_st0;
  SubroutineIndexLoc *this_local;
  
  generator = &(this->super_ExplicitUniformLocationCaseBase).uniformValueGenerator;
  functions_st0.typeName.field_2._8_8_ = this;
  SubroutineFunctionSet::SubroutineFunctionSet((SubroutineFunctionSet *)local_48,generator,0);
  local_190 = (LayoutSpecifierBase)
              LayoutSpecifier<glcts::(anonymous_namespace)::IndexSpecifier>::C(1,Dec);
  local_180 = local_190;
  local_160 = local_190;
  SubroutineFunction::SubroutineFunction(&local_150,generator,(Index)local_190);
  SubroutineFunctionSet::push_back((SubroutineFunctionSet *)local_48,&local_150);
  SubroutineFunction::~SubroutineFunction(&local_150);
  _index = LayoutSpecifier<glcts::(anonymous_namespace)::IndexSpecifier>::C(2,Dec);
  subroutineUniforms.
  super__Vector_base<glcts::(anonymous_namespace)::SubroutineUniform,_std::allocator<glcts::(anonymous_namespace)::SubroutineUniform>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = _index.super_LayoutSpecifierBase._0_8_;
  SubroutineFunction::SubroutineFunction
            (&local_298,&(this->super_ExplicitUniformLocationCaseBase).uniformValueGenerator,
             (Index)_index.super_LayoutSpecifierBase);
  SubroutineFunctionSet::push_back((SubroutineFunctionSet *)local_48,&local_298);
  SubroutineFunction::~SubroutineFunction(&local_298);
  std::
  vector<glcts::(anonymous_namespace)::SubroutineUniform,_std::allocator<glcts::(anonymous_namespace)::SubroutineUniform>_>
  ::vector((vector<glcts::(anonymous_namespace)::SubroutineUniform,_std::allocator<glcts::(anonymous_namespace)::SubroutineUniform>_>
            *)local_2e0);
  local_468 = (LayoutSpecifierBase)
              LayoutSpecifier<glcts::(anonymous_namespace)::LocationSpecifier>::C(3,Dec);
  local_458 = local_468;
  DefOccurence::DefOccurence(&local_46c,FSH_OR_CSH);
  SubroutineUniform::SubroutineUniform
            (&local_448,&(this->super_ExplicitUniformLocationCaseBase).uniformValueGenerator,
             (SubroutineFunctionSet *)local_48,(Loc)local_458,0,local_46c,true);
  std::
  vector<glcts::(anonymous_namespace)::SubroutineUniform,_std::allocator<glcts::(anonymous_namespace)::SubroutineUniform>_>
  ::push_back((vector<glcts::(anonymous_namespace)::SubroutineUniform,_std::allocator<glcts::(anonymous_namespace)::SubroutineUniform>_>
               *)local_2e0,&local_448);
  SubroutineUniform::~SubroutineUniform(&local_448);
  lVar1 = ExplicitUniformLocationCaseBase::doRun
                    (&this->super_ExplicitUniformLocationCaseBase,
                     (vector<glcts::(anonymous_namespace)::SubroutineUniform,_std::allocator<glcts::(anonymous_namespace)::SubroutineUniform>_>
                      *)local_2e0);
  std::
  vector<glcts::(anonymous_namespace)::SubroutineUniform,_std::allocator<glcts::(anonymous_namespace)::SubroutineUniform>_>
  ::~vector((vector<glcts::(anonymous_namespace)::SubroutineUniform,_std::allocator<glcts::(anonymous_namespace)::SubroutineUniform>_>
             *)local_2e0);
  SubroutineFunctionSet::~SubroutineFunctionSet((SubroutineFunctionSet *)local_48);
  return lVar1;
}

Assistant:

virtual long Run()
	{

		//one shader:

		//subroutine vec4 st0(float param);
		SubroutineFunctionSet functions_st0(uniformValueGenerator);
		//layout(index = 1) subroutine(st0) vec4 sf0(float param) { .... };
		functions_st0.push_back(SubroutineFunction(uniformValueGenerator, Index::C(1)));
		//layout(index = 2) subroutine(st0) vec4 sf1(float param) { .... };
		functions_st0.push_back(SubroutineFunction(uniformValueGenerator, Index::C(2)));

		std::vector<SubroutineUniform> subroutineUniforms;

		//layout(location = 3) subroutine uniform st0 u0;
		subroutineUniforms.push_back(
			SubroutineUniform(uniformValueGenerator, functions_st0, Loc::C(3), 0, DefOccurence::FSH_OR_CSH));
		return doRun(subroutineUniforms);
	}